

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O1

void __thiscall
CLineInput::DrawSelection(CLineInput *this,float HeightWeight,int Start,int End,vec4 Color)

{
  float *pfVar1;
  _func_int **pp_Var2;
  float *pfVar3;
  undefined8 uVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar8;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar9;
  float fVar10;
  float fVar11;
  CTextBoundingBox CVar12;
  CQuadItem aSelectionQuads [3];
  float local_a0;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_98;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_94;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_88;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aStack_84;
  undefined1 local_58 [4];
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (this->m_TextCursor).m_Align & 0xc;
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,this,Start);
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,this,(ulong)(uint)End);
  fVar9 = (this->m_TextCursor).m_NextLineAdvanceY / (float)(this->m_TextCursor).m_LineCount;
  if (uVar7 == 4) {
    local_a0 = fVar9 * 0.5;
  }
  else {
    if (uVar7 != 0) {
      local_a0 = (HeightWeight + 0.35000002) * fVar9 + -1.0;
      goto LAB_00187e91;
    }
    local_a0 = -1.0;
  }
  local_a0 = local_a0 - (1.0 - HeightWeight) * fVar9;
LAB_00187e91:
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffff);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_98 = Color.field_0;
  aStack_94 = Color.field_1;
  local_88 = Color.field_2;
  aStack_84 = Color.field_3;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (local_98.x,aStack_94.y,local_88.z,aStack_84.w);
  if (extraout_XMM0_Db_00 <= extraout_XMM0_Db) {
    pp_Var2 = (s_pGraphics->super_IInterface)._vptr_IInterface;
    uVar4 = 1;
    local_50 = extraout_XMM0_Da_00;
  }
  else {
    CVar12 = CTextCursor::AlignedBoundingBox(&this->m_TextCursor);
    fVar8 = CVar12.x + (this->m_TextCursor).m_CursorPos.field_0.x;
    local_50 = CVar12.w + fVar8;
    fVar10 = (extraout_XMM0_Db - local_a0) + fVar9;
    if (extraout_XMM0_Db_00 - extraout_XMM0_Db <= fVar9) {
      pfVar1 = &local_3c;
      pfVar3 = &local_40;
      pfVar5 = &local_44;
      pfVar6 = &local_48;
      uVar4 = 2;
      fVar11 = fVar10;
    }
    else {
      pfVar1 = local_2c;
      pfVar3 = &local_30;
      pfVar5 = &local_34;
      pfVar6 = &local_38;
      local_3c = (extraout_XMM0_Db_00 - extraout_XMM0_Db) - fVar9;
      uVar4 = 3;
      fVar11 = fVar10 + local_3c;
      local_48 = fVar8;
      local_44 = fVar10;
      local_40 = CVar12.w;
    }
    *pfVar6 = fVar8;
    *pfVar5 = fVar11;
    *pfVar3 = extraout_XMM0_Da_00 - fVar8;
    *pfVar1 = HeightWeight * fVar9;
    pp_Var2 = (s_pGraphics->super_IInterface)._vptr_IInterface;
  }
  local_4c = HeightWeight * fVar9;
  local_50 = local_50 - extraout_XMM0_Da;
  local_54 = extraout_XMM0_Db - local_a0;
  (*pp_Var2[0x1d])(s_pGraphics,local_58,uVar4);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLineInput::DrawSelection(float HeightWeight, int Start, int End, vec4 Color)
{
	const int VAlign = m_TextCursor.m_Align&TEXTALIGN_MASK_VERT;

	const vec2 StartPos = s_pTextRender->CaretPosition(&m_TextCursor, Start);
	const vec2 EndPos = s_pTextRender->CaretPosition(&m_TextCursor, End);
	const float LineHeight = m_TextCursor.BaseLineY()/m_TextCursor.LineCount();
	const float VAlignOffset =
		(VAlign == TEXTALIGN_TOP) ? -LineHeight*(1.0f-HeightWeight)-1.0f :
		(VAlign == TEXTALIGN_MIDDLE) ? -LineHeight*(1.0f-HeightWeight)+LineHeight/2 :
		/* TEXTALIGN_BOTTOM */ LineHeight*(1.35f-1.0f+HeightWeight)-1.0f;
	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();
	s_pGraphics->SetColor(Color);
	if(StartPos.y < EndPos.y) // multi line selection
	{
		CTextBoundingBox BoundingBox = m_TextCursor.BoundingBox();
		int NumQuads = 0;
		IGraphics::CQuadItem aSelectionQuads[3];
		aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(StartPos.x, StartPos.y - VAlignOffset, BoundingBox.Right() - StartPos.x, LineHeight*HeightWeight);
		const float SecondSegmentY = StartPos.y - VAlignOffset + LineHeight;
		if(EndPos.y - StartPos.y > LineHeight)
		{
			const float MiddleSegmentHeight = EndPos.y - StartPos.y - LineHeight;
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, BoundingBox.w, MiddleSegmentHeight);
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY + MiddleSegmentHeight, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		}
		else
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(aSelectionQuads, NumQuads);
	}
	else // single line selection
	{
		IGraphics::CQuadItem SelectionQuad(StartPos.x, StartPos.y - VAlignOffset, EndPos.x - StartPos.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(&SelectionQuad, 1);
	}
	s_pGraphics->QuadsEnd();
}